

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckDerivationOKRestriction2to4
              (xmlSchemaParserCtxtPtr pctxt,int action,xmlSchemaBasicItemPtr item,
              xmlSchemaBasicItemPtr baseItem,xmlSchemaItemListPtr uses,xmlSchemaItemListPtr baseUses
              ,xmlSchemaWildcardPtr wild,xmlSchemaWildcardPtr baseWild)

{
  xmlSchemaAttributeUsePtr_conflict pxVar1;
  xmlSchemaItemListPtr item_00;
  xmlSchemaBasicItemPtr pxVar2;
  xmlSchemaParserCtxtPtr pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar *local_d8;
  xmlChar *str_5;
  xmlChar *str_4;
  xmlChar *str_3;
  xmlChar *strB_1;
  xmlChar *strA_1;
  xmlChar *str_2;
  xmlChar *str_1;
  xmlChar *rEffValue;
  xmlChar *strC;
  xmlChar *strB;
  xmlChar *strA;
  xmlChar *str;
  xmlChar *pxStack_70;
  int effFixed;
  xmlChar *bEffValue;
  int local_60;
  int found;
  int j;
  int i;
  xmlSchemaAttributeUsePtr_conflict bcur;
  xmlSchemaAttributeUsePtr_conflict cur;
  xmlSchemaItemListPtr baseUses_local;
  xmlSchemaItemListPtr uses_local;
  xmlSchemaBasicItemPtr baseItem_local;
  xmlSchemaBasicItemPtr item_local;
  xmlSchemaParserCtxtPtr pxStack_20;
  int action_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  bcur = (xmlSchemaAttributeUsePtr_conflict)0x0;
  cur = (xmlSchemaAttributeUsePtr_conflict)baseUses;
  baseUses_local = uses;
  uses_local = (xmlSchemaItemListPtr)baseItem;
  baseItem_local = item;
  item_local._4_4_ = action;
  pxStack_20 = pctxt;
  if (uses != (xmlSchemaItemListPtr)0x0) {
    for (found = 0; pxVar3 = pxStack_20, found < baseUses_local->nbItems; found = found + 1) {
      bcur = (xmlSchemaAttributeUsePtr_conflict)baseUses_local->items[found];
      bEffValue._4_4_ = 0;
      if (cur != (xmlSchemaAttributeUsePtr_conflict)0x0) {
        for (local_60 = 0; local_60 < *(int *)&cur->annot; local_60 = local_60 + 1) {
          _j = *(xmlSchemaAttributeUsePtr_conflict *)(*(long *)cur + (long)local_60 * 8);
          if ((bcur->attrDecl->name == _j->attrDecl->name) &&
             (bcur->attrDecl->targetNamespace == _j->attrDecl->targetNamespace)) {
            bEffValue._4_4_ = 1;
            if ((bcur->occurs == 2) && (_j->occurs == 1)) {
              strA = (xmlChar *)0x0;
              pxVar7 = xmlSchemaGetComponentNode(baseItem_local);
              pxVar2 = baseItem_local;
              pxVar1 = bcur;
              pxVar8 = "redefined";
              if (item_local._4_4_ == 0) {
                pxVar8 = "base";
              }
              pxVar9 = xmlSchemaGetComponentDesignation(&strA,uses_local);
              xmlSchemaPAttrUseErr4
                        (pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_1,pxVar7,pxVar2,pxVar1,
                         "The \'optional\' attribute use is inconsistent with the corresponding \'required\' attribute use of the %s %s"
                         ,pxVar8,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0);
              if (strA != (xmlChar *)0x0) {
                (*xmlFree)(strA);
                strA = (xmlChar *)0x0;
              }
            }
            else {
              iVar4 = xmlSchemaCheckCOSSTDerivedOK
                                ((xmlSchemaAbstractCtxtPtr)pxStack_20,bcur->attrDecl->subtypes,
                                 _j->attrDecl->subtypes,0);
              pxVar3 = pxStack_20;
              if (iVar4 == 0) {
                xmlSchemaGetEffectiveValueConstraint
                          (_j,(int *)((long)&str + 4),&stack0xffffffffffffff90,
                           (xmlSchemaValPtr *)0x0);
                if ((pxStack_70 != (xmlChar *)0x0) && (str._4_4_ == 1)) {
                  str_1 = (xmlChar *)0x0;
                  xmlSchemaGetEffectiveValueConstraint
                            (_j,(int *)((long)&str + 4),&str_1,(xmlSchemaValPtr *)0x0);
                  pxVar3 = pxStack_20;
                  if ((str._4_4_ == 0) || (str_1 != pxStack_70)) {
                    str_2 = (xmlChar *)0x0;
                    pxVar7 = xmlSchemaGetComponentNode(baseItem_local);
                    pxVar2 = baseItem_local;
                    pxVar1 = bcur;
                    pxVar8 = "redefined";
                    if (item_local._4_4_ == 0) {
                      pxVar8 = "base";
                    }
                    pxVar9 = xmlSchemaGetComponentDesignation(&str_2,uses_local);
                    xmlSchemaPAttrUseErr4
                              (pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_3,pxVar7,pxVar2,
                               pxVar1,
                               "The effective value constraint of the attribute use is inconsistent with its correspondent in the %s %s"
                               ,pxVar8,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0);
                    if (str_2 != (xmlChar *)0x0) {
                      (*xmlFree)(str_2);
                      str_2 = (xmlChar *)0x0;
                    }
                  }
                }
              }
              else {
                strB = (xmlChar *)0x0;
                strC = (xmlChar *)0x0;
                rEffValue = (xmlChar *)0x0;
                pxVar7 = xmlSchemaGetComponentNode(baseItem_local);
                pxVar2 = baseItem_local;
                pxVar1 = bcur;
                pxVar8 = xmlSchemaGetComponentDesignation(&strB,bcur->attrDecl->subtypes);
                pxVar9 = xmlSchemaGetComponentDesignation(&strC,_j->attrDecl->subtypes);
                pxVar5 = "redefined";
                if (item_local._4_4_ == 0) {
                  pxVar5 = "base";
                }
                pxVar6 = xmlSchemaGetComponentDesignation(&rEffValue,uses_local);
                xmlSchemaPAttrUseErr4
                          (pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_2,pxVar7,pxVar2,pxVar1,
                           "The attribute declaration\'s %s is not validly derived from the corresponding %s of the attribute declaration in the %s %s"
                           ,pxVar8,pxVar9,pxVar5,pxVar6);
                if (strB != (xmlChar *)0x0) {
                  (*xmlFree)(strB);
                  strB = (xmlChar *)0x0;
                }
                if (strC != (xmlChar *)0x0) {
                  (*xmlFree)(strC);
                  strC = (xmlChar *)0x0;
                }
                if (rEffValue != (xmlChar *)0x0) {
                  (*xmlFree)(rEffValue);
                  rEffValue = (xmlChar *)0x0;
                }
              }
            }
            break;
          }
        }
      }
      if ((bEffValue._4_4_ == 0) &&
         ((baseWild == (xmlSchemaWildcardPtr)0x0 ||
          (iVar4 = xmlSchemaCheckCVCWildcardNamespace(baseWild,bcur->attrDecl->targetNamespace),
          iVar4 != 0)))) {
        pxVar3 = pxStack_20;
        strA_1 = (xmlChar *)0x0;
        pxVar7 = xmlSchemaGetComponentNode(baseItem_local);
        pxVar2 = baseItem_local;
        pxVar1 = bcur;
        pxVar8 = "redefined";
        if (item_local._4_4_ == 0) {
          pxVar8 = "base";
        }
        pxVar9 = xmlSchemaGetComponentDesignation(&strA_1,uses_local);
        xmlSchemaPAttrUseErr4
                  (pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_2,pxVar7,pxVar2,pxVar1,
                   "Neither a matching attribute use, nor a matching wildcard exists in the %s %s",
                   pxVar8,pxVar9,(xmlChar *)0x0,(xmlChar *)0x0);
        if (strA_1 != (xmlChar *)0x0) {
          (*xmlFree)(strA_1);
          strA_1 = (xmlChar *)0x0;
        }
      }
    }
  }
  if (cur != (xmlSchemaAttributeUsePtr_conflict)0x0) {
    for (local_60 = 0; pxVar3 = pxStack_20, pxVar2 = baseItem_local, local_60 < *(int *)&cur->annot;
        local_60 = local_60 + 1) {
      _j = *(xmlSchemaAttributeUsePtr_conflict *)(*(long *)cur + (long)local_60 * 8);
      if (_j->occurs == 1) {
        bEffValue._4_4_ = 0;
        if (baseUses_local != (xmlSchemaItemListPtr)0x0) {
          for (found = 0; found < baseUses_local->nbItems; found = found + 1) {
            bcur = (xmlSchemaAttributeUsePtr_conflict)baseUses_local->items[found];
            if ((bcur->attrDecl->name == _j->attrDecl->name) &&
               (bcur->attrDecl->targetNamespace == _j->attrDecl->targetNamespace)) {
              bEffValue._4_4_ = 1;
              break;
            }
          }
        }
        if (bEffValue._4_4_ == 0) {
          strB_1 = (xmlChar *)0x0;
          str_3 = (xmlChar *)0x0;
          pxVar8 = xmlSchemaGetComponentDesignation(&strB_1,_j);
          pxVar9 = "redefined";
          if (item_local._4_4_ == 0) {
            pxVar9 = "base";
          }
          pxVar5 = xmlSchemaGetComponentDesignation(&str_3,uses_local);
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar3,
                              XML_SCHEMAP_DERIVATION_OK_RESTRICTION_3,(xmlNodePtr)0x0,pxVar2,
                              "A matching attribute use for the \'required\' %s of the %s %s is missing"
                              ,pxVar8,pxVar9,pxVar5,(xmlChar *)0x0);
          if (strB_1 != (xmlChar *)0x0) {
            (*xmlFree)(strB_1);
            strB_1 = (xmlChar *)0x0;
          }
          if (str_3 != (xmlChar *)0x0) {
            (*xmlFree)(str_3);
            str_3 = (xmlChar *)0x0;
          }
        }
      }
    }
  }
  pxVar3 = pxStack_20;
  pxVar2 = baseItem_local;
  if (wild != (xmlSchemaWildcardPtr)0x0) {
    if (baseWild == (xmlSchemaWildcardPtr)0x0) {
      str_4 = (xmlChar *)0x0;
      pxVar8 = xmlSchemaGetComponentTypeStr(baseItem_local);
      pxVar9 = "redefined";
      if (item_local._4_4_ == 0) {
        pxVar9 = "base";
      }
      pxVar5 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)uses_local);
      pxVar6 = xmlSchemaGetComponentQName(&str_4,uses_local);
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_1
                          ,(xmlNodePtr)0x0,pxVar2,
                          "The %s has an attribute wildcard, but the %s %s \'%s\' does not have one"
                          ,pxVar8,pxVar9,pxVar5,pxVar6);
      if (str_4 != (xmlChar *)0x0) {
        (*xmlFree)(str_4);
      }
      return pxStack_20->err;
    }
    if ((baseWild->any == 0) &&
       (iVar4 = xmlSchemaCheckCOSNSSubset(wild,baseWild), pxVar3 = pxStack_20,
       pxVar2 = baseItem_local, iVar4 != 0)) {
      str_5 = (xmlChar *)0x0;
      pxVar8 = "redefined";
      if (item_local._4_4_ == 0) {
        pxVar8 = "base";
      }
      pxVar9 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)uses_local);
      pxVar5 = xmlSchemaGetComponentQName(&str_5,uses_local);
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_2
                          ,(xmlNodePtr)0x0,pxVar2,
                          "The attribute wildcard is not a valid subset of the wildcard in the %s %s \'%s\'"
                          ,pxVar8,pxVar9,pxVar5,(xmlChar *)0x0);
      if (str_5 != (xmlChar *)0x0) {
        (*xmlFree)(str_5);
      }
      return pxStack_20->err;
    }
    pxVar3 = pxStack_20;
    item_00 = uses_local;
    if (((*(int *)&uses_local->items != 1) || (*(int *)&uses_local[10].items != 0x2d)) &&
       (wild->processContents < baseWild->processContents)) {
      local_d8 = (xmlChar *)0x0;
      pxVar8 = "redefined";
      if (item_local._4_4_ == 0) {
        pxVar8 = "base";
      }
      pxVar9 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)uses_local);
      pxVar5 = xmlSchemaGetComponentQName(&local_d8,uses_local);
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar3,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_3
                          ,(xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)item_00,
                          "The {process contents} of the attribute wildcard is weaker than the one in the %s %s \'%s\'"
                          ,pxVar8,pxVar9,pxVar5,(xmlChar *)0x0);
      if (local_d8 != (xmlChar *)0x0) {
        (*xmlFree)(local_d8);
      }
      return pxStack_20->err;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaCheckDerivationOKRestriction2to4(xmlSchemaParserCtxtPtr pctxt,
				       int action,
				       xmlSchemaBasicItemPtr item,
				       xmlSchemaBasicItemPtr baseItem,
				       xmlSchemaItemListPtr uses,
				       xmlSchemaItemListPtr baseUses,
				       xmlSchemaWildcardPtr wild,
				       xmlSchemaWildcardPtr baseWild)
{
    xmlSchemaAttributeUsePtr cur = NULL, bcur;
    int i, j, found; /* err = 0; */
    const xmlChar *bEffValue;
    int effFixed;

    if (uses != NULL) {
	for (i = 0; i < uses->nbItems; i++) {
	    cur = uses->items[i];
	    found = 0;
	    if (baseUses == NULL)
		goto not_found;
	    for (j = 0; j < baseUses->nbItems; j++) {
		bcur = baseUses->items[j];
		if ((WXS_ATTRUSE_DECL_NAME(cur) ==
			WXS_ATTRUSE_DECL_NAME(bcur)) &&
		    (WXS_ATTRUSE_DECL_TNS(cur) ==
			WXS_ATTRUSE_DECL_TNS(bcur)))
		{
		    /*
		    * (2.1) "If there is an attribute use in the {attribute
		    * uses} of the {base type definition} (call this B) whose
		    * {attribute declaration} has the same {name} and {target
		    * namespace}, then  all of the following must be true:"
		    */
		    found = 1;

		    if ((cur->occurs == XML_SCHEMAS_ATTR_USE_OPTIONAL) &&
			(bcur->occurs == XML_SCHEMAS_ATTR_USE_REQUIRED))
		    {
			xmlChar *str = NULL;
			/*
			* (2.1.1) "one of the following must be true:"
			* (2.1.1.1) "B's {required} is false."
			* (2.1.1.2) "R's {required} is true."
			*/
			xmlSchemaPAttrUseErr4(pctxt,
			    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_1,
			    WXS_ITEM_NODE(item), item, cur,
			    "The 'optional' attribute use is inconsistent "
			    "with the corresponding 'required' attribute use of "
			    "the %s %s",
			    WXS_ACTION_STR(action),
			    xmlSchemaGetComponentDesignation(&str, baseItem),
			    NULL, NULL);
			FREE_AND_NULL(str);
			/* err = pctxt->err; */
		    } else if (xmlSchemaCheckCOSSTDerivedOK(ACTXT_CAST pctxt,
			WXS_ATTRUSE_TYPEDEF(cur),
			WXS_ATTRUSE_TYPEDEF(bcur), 0) != 0)
		    {
			xmlChar *strA = NULL, *strB = NULL, *strC = NULL;

			/*
			* SPEC (2.1.2) "R's {attribute declaration}'s
			* {type definition} must be validly derived from
			* B's {type definition} given the empty set as
			* defined in Type Derivation OK (Simple) ($3.14.6)."
			*/
			xmlSchemaPAttrUseErr4(pctxt,
			    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_2,
			    WXS_ITEM_NODE(item), item, cur,
			    "The attribute declaration's %s "
			    "is not validly derived from "
			    "the corresponding %s of the "
			    "attribute declaration in the %s %s",
			    xmlSchemaGetComponentDesignation(&strA,
				WXS_ATTRUSE_TYPEDEF(cur)),
			    xmlSchemaGetComponentDesignation(&strB,
				WXS_ATTRUSE_TYPEDEF(bcur)),
			    WXS_ACTION_STR(action),
			    xmlSchemaGetComponentDesignation(&strC, baseItem));
			    /* xmlSchemaGetComponentDesignation(&str, baseItem), */
			FREE_AND_NULL(strA);
			FREE_AND_NULL(strB);
			FREE_AND_NULL(strC);
			/* err = pctxt->err; */
		    } else {
			/*
			* 2.1.3 [Definition:]  Let the effective value
			* constraint of an attribute use be its {value
			* constraint}, if present, otherwise its {attribute
			* declaration}'s {value constraint} .
			*/
			xmlSchemaGetEffectiveValueConstraint(bcur,
			    &effFixed, &bEffValue, NULL);
			/*
			* 2.1.3 ... one of the following must be true
			*
			* 2.1.3.1 B's `effective value constraint` is
			* `absent` or default.
			*/
			if ((bEffValue != NULL) &&
			    (effFixed == 1)) {
			    const xmlChar *rEffValue = NULL;

			    xmlSchemaGetEffectiveValueConstraint(bcur,
				&effFixed, &rEffValue, NULL);
			    /*
			    * 2.1.3.2 R's `effective value constraint` is
			    * fixed with the same string as B's.
			    * MAYBE TODO: Compare the computed values.
			    *       Hmm, it says "same string" so
			    *       string-equality might really be sufficient.
			    */
			    if ((effFixed == 0) ||
				(! WXS_ARE_DEFAULT_STR_EQUAL(rEffValue, bEffValue)))
			    {
				xmlChar *str = NULL;

				xmlSchemaPAttrUseErr4(pctxt,
				    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_3,
				    WXS_ITEM_NODE(item), item, cur,
				    "The effective value constraint of the "
				    "attribute use is inconsistent with "
				    "its correspondent in the %s %s",
				    WXS_ACTION_STR(action),
				    xmlSchemaGetComponentDesignation(&str,
					baseItem),
				    NULL, NULL);
				FREE_AND_NULL(str);
				/* err = pctxt->err; */
			    }
			}
		    }
		    break;
		}
	    }
not_found:
	    if (!found) {
		/*
		* (2.2) "otherwise the {base type definition} must have an
		* {attribute wildcard} and the {target namespace} of the
		* R's {attribute declaration} must be `valid` with respect
		* to that wildcard, as defined in Wildcard allows Namespace
		* Name ($3.10.4)."
		*/
		if ((baseWild == NULL) ||
		    (xmlSchemaCheckCVCWildcardNamespace(baseWild,
		    (WXS_ATTRUSE_DECL(cur))->targetNamespace) != 0))
		{
		    xmlChar *str = NULL;

		    xmlSchemaPAttrUseErr4(pctxt,
			XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_2,
			WXS_ITEM_NODE(item), item, cur,
			"Neither a matching attribute use, "
			"nor a matching wildcard exists in the %s %s",
			WXS_ACTION_STR(action),
			xmlSchemaGetComponentDesignation(&str, baseItem),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /* err = pctxt->err; */
		}
	    }
	}
    }
    /*
    * SPEC derivation-ok-restriction (3):
    * (3) "For each attribute use in the {attribute uses} of the {base type
    * definition} whose {required} is true, there must be an attribute
    * use with an {attribute declaration} with the same {name} and
    * {target namespace} as its {attribute declaration} in the {attribute
    * uses} of the complex type definition itself whose {required} is true.
    */
    if (baseUses != NULL) {
	for (j = 0; j < baseUses->nbItems; j++) {
	    bcur = baseUses->items[j];
	    if (bcur->occurs != XML_SCHEMAS_ATTR_USE_REQUIRED)
		continue;
	    found = 0;
	    if (uses != NULL) {
		for (i = 0; i < uses->nbItems; i++) {
		    cur = uses->items[i];
		    if ((WXS_ATTRUSE_DECL_NAME(cur) ==
			WXS_ATTRUSE_DECL_NAME(bcur)) &&
			(WXS_ATTRUSE_DECL_TNS(cur) ==
			WXS_ATTRUSE_DECL_TNS(bcur))) {
			found = 1;
			break;
		    }
		}
	    }
	    if (!found) {
		xmlChar *strA = NULL, *strB = NULL;

		xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_3,
		    NULL, item,
		    "A matching attribute use for the "
		    "'required' %s of the %s %s is missing",
		    xmlSchemaGetComponentDesignation(&strA, bcur),
		    WXS_ACTION_STR(action),
		    xmlSchemaGetComponentDesignation(&strB, baseItem),
		    NULL);
		FREE_AND_NULL(strA);
		FREE_AND_NULL(strB);
	    }
	}
    }
    /*
    * derivation-ok-restriction (4)
    */
    if (wild != NULL) {
	/*
	* (4) "If there is an {attribute wildcard}, all of the
	* following must be true:"
	*/
	if (baseWild == NULL) {
	    xmlChar *str = NULL;

	    /*
	    * (4.1) "The {base type definition} must also have one."
	    */
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_1,
		NULL, item,
		"The %s has an attribute wildcard, "
		"but the %s %s '%s' does not have one",
		WXS_ITEM_TYPE_NAME(item),
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem));
	    FREE_AND_NULL(str);
	    return(pctxt->err);
	} else if ((baseWild->any == 0) &&
		xmlSchemaCheckCOSNSSubset(wild, baseWild))
	{
	    xmlChar *str = NULL;
	    /*
	    * (4.2) "The complex type definition's {attribute wildcard}'s
	    * {namespace constraint} must be a subset of the {base type
	    * definition}'s {attribute wildcard}'s {namespace constraint},
	    * as defined by Wildcard Subset ($3.10.6)."
	    */
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_2,
		NULL, item,
		"The attribute wildcard is not a valid "
		"subset of the wildcard in the %s %s '%s'",
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem),
		NULL);
	    FREE_AND_NULL(str);
	    return(pctxt->err);
	}
	/* 4.3 Unless the {base type definition} is the `ur-type
	* definition`, the complex type definition's {attribute
	* wildcard}'s {process contents} must be identical to or
	* stronger than the {base type definition}'s {attribute
	* wildcard}'s {process contents}, where strict is stronger
	* than lax is stronger than skip.
	*/
	if ((! WXS_IS_ANYTYPE(baseItem)) &&
	    (wild->processContents < baseWild->processContents)) {
	    xmlChar *str = NULL;
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_3,
		NULL, baseItem,
		"The {process contents} of the attribute wildcard is "
		"weaker than the one in the %s %s '%s'",
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem),
		NULL);
	    FREE_AND_NULL(str)
		return(pctxt->err);
	}
    }
    return(0);
}